

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O1

type __thiscall
llvm::make_unique<(anonymous_namespace)::SharedLibraryTool,llvm::StringRef&>
          (llvm *this,StringRef *args)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 *puVar3;
  
  puVar3 = (undefined8 *)operator_new(0x28);
  pcVar1 = args->Data;
  sVar2 = args->Length;
  *puVar3 = &PTR__Tool_002577b0;
  puVar3[1] = puVar3 + 3;
  if (pcVar1 == (char *)0x0) {
    puVar3[2] = 0;
    *(undefined1 *)(puVar3 + 3) = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)(puVar3 + 1),pcVar1,pcVar1 + sVar2);
  }
  *puVar3 = &PTR__Tool_00256910;
  *(undefined8 **)this = puVar3;
  return (__uniq_ptr_data<(anonymous_namespace)::SharedLibraryTool,_std::default_delete<(anonymous_namespace)::SharedLibraryTool>,_true,_true>
          )(__uniq_ptr_data<(anonymous_namespace)::SharedLibraryTool,_std::default_delete<(anonymous_namespace)::SharedLibraryTool>,_true,_true>
            )this;
}

Assistant:

typename std::enable_if<!std::is_array<T>::value, std::unique_ptr<T>>::type
make_unique(Args &&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}